

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

RETURN_TYPE __thiscall
duckdb::DBConfig::GetSetting<duckdb::EnableMacroDependenciesSetting>
          (DBConfig *this,ClientContext *context)

{
  bool bVar1;
  Value VStack_58;
  
  ::std::mutex::lock(&this->config_lock);
  EnableMacroDependenciesSetting::GetSetting(&VStack_58,context);
  bVar1 = Value::GetValue<bool>(&VStack_58);
  Value::~Value(&VStack_58);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar1;
}

Assistant:

typename OP::RETURN_TYPE GetSetting(const ClientContext &context) {
		std::lock_guard<mutex> lock(config_lock);
		return OP::GetSetting(context).template GetValue<typename OP::RETURN_TYPE>();
	}